

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_double(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            double val,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  double in_RCX;
  back_insert_iterator<jsoncons::binary_stream_sink> in_RDX;
  undefined8 in_RDI;
  float fVar1;
  binary_stream_sink *in_XMM0_Qa;
  float valf;
  binary_stream_sink *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  uint8_t ch;
  binary_stream_sink *in_stack_ffffffffffffffc0;
  float val_00;
  
  fVar1 = (float)(double)in_XMM0_Qa;
  ch = (uint8_t)((ulong)in_RDI >> 0x38);
  if (((double)fVar1 != (double)in_XMM0_Qa) || (NAN((double)fVar1) || NAN((double)in_XMM0_Qa))) {
    binary_stream_sink::push_back(in_stack_ffffffffffffffc0,ch);
    std::back_inserter<jsoncons::binary_stream_sink>(in_XMM0_Qa);
    binary::
    native_to_big<double,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (in_RCX,in_RDX);
  }
  else {
    binary_stream_sink::push_back(in_stack_ffffffffffffffc0,ch);
    val_00 = (float)((ulong)in_RCX >> 0x20);
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffffa8);
    binary::
    native_to_big<float,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val_00,in_RDX);
    in_stack_ffffffffffffffb4 = fVar1;
  }
  end_value((basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double val, 
            semantic_tag,
            const ser_context&,
            std::error_code&) final
        {
            float valf = (float)val;
            if ((double)valf == val)
            {
                // float 32
                sink_.push_back(jsoncons::msgpack::msgpack_type::float32_type);
                binary::native_to_big(valf,std::back_inserter(sink_));
            }
            else
            {
                // float 64
                sink_.push_back(jsoncons::msgpack::msgpack_type::float64_type);
                binary::native_to_big(val,std::back_inserter(sink_));
            }

            // write double

            end_value();
            JSONCONS_VISITOR_RETURN;
        }